

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_1::CreateThread<vkt::api::(anonymous_namespace)::Device>::runThread
          (CreateThread<vkt::api::(anonymous_namespace)::Device> *this)

{
  Parameters *in_RCX;
  int iterNdx;
  uint uVar1;
  RefBase<vk::VkDevice_s_*> local_58;
  RefBase<vk::VkDevice_s_*> local_38;
  
  for (uVar1 = 0; uVar1 != 0x14; uVar1 = uVar1 + 1) {
    if ((uVar1 & 3) == 0) {
      ThreadGroupThread::barrier(&this->super_ThreadGroupThread);
    }
    Device::create((Move<vk::VkDevice_s_*> *)&local_58,this->m_env,this->m_resources,in_RCX);
    local_38.m_data.deleter.m_allocator = local_58.m_data.deleter.m_allocator;
    local_38.m_data.object = local_58.m_data.object;
    local_38.m_data.deleter.m_destroyDevice = local_58.m_data.deleter.m_destroyDevice;
    local_58.m_data.object = (VkDevice_s *)0x0;
    local_58.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
    local_58.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_58);
    ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_38);
  }
  return;
}

Assistant:

void runThread (void)
	{
		const int	numIters			= getCreateCount<Object>();
		const int	itersBetweenSyncs	= numIters / 5;

		DE_ASSERT(itersBetweenSyncs > 0);

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			// Sync every Nth iteration to make entering driver at the same time more likely
			if ((iterNdx % itersBetweenSyncs) == 0)
				barrier();

			{
				Unique<typename Object::Type>	obj	(Object::create(m_env, m_resources, m_params));
			}
		}
	}